

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

uint parseLine(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *parts)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong uVar2;
  char *__nptr;
  raw_ostream *in_RDI;
  uint idx;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI);
  if (__lhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2) {
    uVar3 = 0;
  }
  else if (__lhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3) {
    uVar3 = 1;
  }
  else {
    if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4) {
      return 0;
    }
    uVar3 = 2;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_RDI,(ulong)uVar3);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,(ulong)uVar3);
    bVar1 = std::operator==(__lhs,in_stack_ffffffffffffffd8);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,(ulong)uVar3);
      bVar1 = isNumber((string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (!bVar1) {
        llvm::errs();
        llvm::raw_ostream::operator<<(in_RDI,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_RDI,(ulong)uVar3);
        llvm::raw_ostream::operator<<(in_RDI,(string *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
        llvm::raw_ostream::operator<<(in_RDI,(char *)CONCAT44(uVar3,in_stack_ffffffffffffffe8));
        return 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_RDI,(ulong)uVar3);
      __nptr = (char *)std::__cxx11::string::c_str();
      uVar3 = atoi(__nptr);
      return uVar3;
    }
  }
  return 0;
}

Assistant:

static unsigned parseLine(const std::vector<std::string> &parts) {
    unsigned idx = -1;
    switch (parts.size()) {
    case 2:
        idx = 0;
        break;
    case 3:
        idx = 1;
        break;
    case 4:
        idx = 2;
        break;
    default:
        return 0;
    }

    assert(idx == 0 || idx <= 2);
    assert(idx < parts.size());

    if (parts[idx].empty() || parts[idx] == "*")
        return 0; // any line

    // will we support multiple lines separated by comma?
    if (!isNumber(parts[idx])) {
        llvm::errs() << "ERROR: invalid line number: " << parts[idx] << "\n";
        return 0;
    }

    return atoi(parts[idx].c_str());
}